

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_14fc750::TargetIncludeDirectoriesImpl::HandleMissingTarget
          (TargetIncludeDirectoriesImpl *this,string *name)

{
  cmMakefile *this_00;
  string local_30;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  cmStrCat<char_const(&)[48],std::__cxx11::string_const&,char_const(&)[38]>
            (&local_30,(char (*) [48])"Cannot specify include directories for target \"",name,
             (char (*) [38])"\" which is not built by this project.");
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify include directories for target \"", name,
               "\" which is not built by this project."));
  }